

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VCVT_f64_f16(DisasContext_conflict1 *s,arg_VCVT_f64_f16 *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr arg2;
  _Bool _Var1;
  TCGv_ptr arg2_00;
  TCGv_i32 arg3;
  TCGv_i32 ret;
  long offset;
  TCGv_i64 retval;
  TCGv_i64 vd;
  TCGv_i32 tmp;
  TCGv_i32 ahp_mode;
  TCGv_ptr fpst;
  TCGContext_conflict1 *tcg_ctx;
  arg_VCVT_f64_f16 *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_fpdp_v2(s->isar);
  if (_Var1) {
    _Var1 = isar_feature_aa32_fp16_dpconv(s->isar);
    if (_Var1) {
      _Var1 = isar_feature_aa32_simd_r32(s->isar);
      if ((_Var1) || ((a->vd & 0x10U) == 0)) {
        _Var1 = vfp_access_check(s);
        if (_Var1) {
          arg2_00 = get_fpstatus_ptr_aarch64(tcg_ctx_00,0);
          arg3 = get_ahp_flag(tcg_ctx_00);
          ret = tcg_temp_new_i32(tcg_ctx_00);
          arg2 = tcg_ctx_00->cpu_env;
          offset = vfp_f16_offset(a->vm,a->t != 0);
          tcg_gen_ld16u_i32(tcg_ctx_00,ret,arg2,offset);
          retval = tcg_temp_new_i64(tcg_ctx_00);
          gen_helper_vfp_fcvt_f16_to_f64(tcg_ctx_00,retval,ret,arg2_00,arg3);
          neon_store_reg64(tcg_ctx_00,retval,a->vd);
          tcg_temp_free_i32(tcg_ctx_00,arg3);
          tcg_temp_free_ptr(tcg_ctx_00,arg2_00);
          tcg_temp_free_i32(tcg_ctx_00,ret);
          tcg_temp_free_i64(tcg_ctx_00,retval);
          s_local._7_1_ = true;
        }
        else {
          s_local._7_1_ = true;
        }
      }
      else {
        s_local._7_1_ = false;
      }
    }
    else {
      s_local._7_1_ = false;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VCVT_f64_f16(DisasContext *s, arg_VCVT_f64_f16 *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr fpst;
    TCGv_i32 ahp_mode;
    TCGv_i32 tmp;
    TCGv_i64 vd;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    if (!dc_isar_feature(aa32_fp16_dpconv, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && (a->vd  & 0x10)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    fpst = get_fpstatus_ptr(tcg_ctx, false);
    ahp_mode = get_ahp_flag(tcg_ctx);
    tmp = tcg_temp_new_i32(tcg_ctx);
    /* The T bit tells us if we want the low or high 16 bits of Vm */
    tcg_gen_ld16u_i32(tcg_ctx, tmp, tcg_ctx->cpu_env, vfp_f16_offset(a->vm, a->t));
    vd = tcg_temp_new_i64(tcg_ctx);
    gen_helper_vfp_fcvt_f16_to_f64(tcg_ctx, vd, tmp, fpst, ahp_mode);
    neon_store_reg64(tcg_ctx, vd, a->vd);
    tcg_temp_free_i32(tcg_ctx, ahp_mode);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_temp_free_i64(tcg_ctx, vd);
    return true;
}